

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O2

void __thiscall
flatbuffers::python::PythonGenerator::StructBuilderBody
          (PythonGenerator *this,StructDef *struct_def,char *nameprefix,string *code_ptr,
          size_t index,bool in_array)

{
  FieldDef *field;
  StructDef *pSVar1;
  StructDef *struct_def_00;
  BaseType BVar2;
  IdlNamer *pIVar3;
  size_t index_00;
  pointer ppFVar4;
  pointer ppFVar5;
  unsigned_long uVar6;
  BaseType BVar7;
  size_t i;
  unsigned_long t;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  PythonGenerator *local_f8;
  size_t local_f0;
  string local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> index_var;
  string indent;
  string local_50;
  
  indent._M_dataplus._M_p = (pointer)&indent.field_2;
  local_f8 = this;
  local_f0 = index;
  std::__cxx11::string::_M_construct((ulong)&indent,(char)index * '\x04');
  std::operator+(&local_138,&indent,"    builder.Prep(");
  NumToString<unsigned_long>(&local_e8,struct_def->minalign);
  std::operator+(&local_118,&local_138,&local_e8);
  std::operator+(&index_var,&local_118,", ");
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&index_var);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_138);
  NumToString<unsigned_long>(&local_118,struct_def->bytesize);
  std::operator+(&index_var,&local_118,")\n");
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&index_var);
  std::__cxx11::string::~string((string *)&local_118);
  ppFVar4 = (struct_def->fields).vec.
            super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  pIVar3 = &local_f8->namer_;
  index_00 = local_f0 + 1;
  do {
    ppFVar5 = ppFVar4;
    while( true ) {
      ppFVar4 = ppFVar5 + -1;
      if (ppFVar5 ==
          (struct_def->fields).vec.
          super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        std::__cxx11::string::~string((string *)&indent);
        return;
      }
      field = *ppFVar4;
      BVar2 = (field->value).type.base_type;
      BVar7 = BVar2;
      if (BVar2 == BASE_TYPE_ARRAY) {
        BVar7 = (field->value).type.element;
      }
      pSVar1 = (field->value).type.struct_def;
      if (field->padding != 0) {
        std::operator+(&local_138,&indent,"    builder.Pad(");
        NumToString<unsigned_long>(&local_e8,field->padding);
        std::operator+(&local_118,&local_138,&local_e8);
        std::operator+(&index_var,&local_118,")\n");
        std::__cxx11::string::append((string *)code_ptr);
        std::__cxx11::string::~string((string *)&index_var);
        std::__cxx11::string::~string((string *)&local_118);
        std::__cxx11::string::~string((string *)&local_e8);
        std::__cxx11::string::~string((string *)&local_138);
        BVar2 = (field->value).type.base_type;
      }
      if ((BVar2 != BASE_TYPE_STRUCT) ||
         (struct_def_00 = (field->value).type.struct_def, struct_def_00->fixed != true)) break;
      (*(pIVar3->super_Namer)._vptr_Namer[0x12])(&local_138,pIVar3,field);
      std::operator+(&local_118,&local_138,"_");
      std::operator+(&index_var,nameprefix,&local_118);
      StructBuilderBody(local_f8,struct_def_00,index_var._M_dataplus._M_p,code_ptr,local_f0,
                        (bool)(in_array & 1));
      std::__cxx11::string::~string((string *)&index_var);
      std::__cxx11::string::~string((string *)&local_118);
      std::__cxx11::string::~string((string *)&local_138);
      ppFVar5 = ppFVar4;
    }
    NumToString<unsigned_long>(&local_118,local_f0);
    std::operator+(&index_var,"_idx",&local_118);
    std::__cxx11::string::~string((string *)&local_118);
    if ((field->value).type.base_type == BASE_TYPE_ARRAY) {
      std::operator+(&local_e8,&indent,"    for ");
      std::operator+(&local_138,&local_e8,&index_var);
      std::operator+(&local_118,&local_138," in range(");
      std::__cxx11::string::append((string *)code_ptr);
      std::__cxx11::string::~string((string *)&local_118);
      std::__cxx11::string::~string((string *)&local_138);
      std::__cxx11::string::~string((string *)&local_e8);
      NumToString<unsigned_short>(&local_118,(field->value).type.fixed_length);
      std::__cxx11::string::append((string *)code_ptr);
      std::__cxx11::string::~string((string *)&local_118);
      in_array = true;
      std::__cxx11::string::append((char *)code_ptr);
    }
    if ((BVar7 == BASE_TYPE_STRUCT) && (pSVar1->fixed == true)) {
      pSVar1 = (field->value).type.struct_def;
      (*(pIVar3->super_Namer)._vptr_Namer[0x12])(&local_e8,pIVar3,field);
      std::operator+(&local_138,&local_e8,"_");
      std::operator+(&local_118,nameprefix,&local_138);
      StructBuilderBody(local_f8,pSVar1,local_118._M_dataplus._M_p,code_ptr,index_00,
                        (bool)(in_array & 1));
      std::__cxx11::string::~string((string *)&local_118);
      std::__cxx11::string::~string((string *)&local_138);
      std::__cxx11::string::~string((string *)&local_e8);
    }
    else {
      std::__cxx11::string::append((char *)code_ptr);
      std::operator+(&local_e8,&indent,"    builder.Prepend");
      GenMethod_abi_cxx11_(&local_50,local_f8,field);
      std::operator+(&local_138,&local_e8,&local_50);
      std::operator+(&local_118,&local_138,"(");
      std::__cxx11::string::append((string *)code_ptr);
      std::__cxx11::string::~string((string *)&local_118);
      std::__cxx11::string::~string((string *)&local_138);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_e8);
      (*(pIVar3->super_Namer)._vptr_Namer[7])(&local_138,pIVar3,field);
      std::operator+(&local_118,nameprefix,&local_138);
      std::__cxx11::string::append((string *)code_ptr);
      std::__cxx11::string::~string((string *)&local_118);
      std::__cxx11::string::~string((string *)&local_138);
      if ((in_array & 1U) != 0) {
        uVar6 = ((field->value).type.base_type == BASE_TYPE_ARRAY) + local_f0;
        for (t = 0; uVar6 != t; t = t + 1) {
          NumToString<unsigned_long>(&local_e8,t);
          std::operator+(&local_138,"[_idx",&local_e8);
          std::operator+(&local_118,&local_138,"-1]");
          std::__cxx11::string::append((string *)code_ptr);
          std::__cxx11::string::~string((string *)&local_118);
          std::__cxx11::string::~string((string *)&local_138);
          std::__cxx11::string::~string((string *)&local_e8);
        }
      }
      std::__cxx11::string::append((char *)code_ptr);
    }
    std::__cxx11::string::~string((string *)&index_var);
  } while( true );
}

Assistant:

void StructBuilderBody(const StructDef &struct_def, const char *nameprefix,
                         std::string *code_ptr, size_t index = 0,
                         bool in_array = false) const {
    auto &code = *code_ptr;
    std::string indent(index * 4, ' ');
    code +=
        indent + "    builder.Prep(" + NumToString(struct_def.minalign) + ", ";
    code += NumToString(struct_def.bytesize) + ")\n";
    for (auto it = struct_def.fields.vec.rbegin();
         it != struct_def.fields.vec.rend(); ++it) {
      auto &field = **it;
      const auto &field_type = field.value.type;
      const auto &type =
          IsArray(field_type) ? field_type.VectorType() : field_type;
      if (field.padding)
        code +=
            indent + "    builder.Pad(" + NumToString(field.padding) + ")\n";
      if (IsStruct(field_type)) {
        StructBuilderBody(*field_type.struct_def,
                          (nameprefix + (namer_.Field(field) + "_")).c_str(),
                          code_ptr, index, in_array);
      } else {
        const auto index_var = "_idx" + NumToString(index);
        if (IsArray(field_type)) {
          code += indent + "    for " + index_var + " in range(";
          code += NumToString(field_type.fixed_length);
          code += " , 0, -1):\n";
          in_array = true;
        }
        if (IsStruct(type)) {
          StructBuilderBody(*field_type.struct_def,
                            (nameprefix + (namer_.Field(field) + "_")).c_str(),
                            code_ptr, index + 1, in_array);
        } else {
          code += IsArray(field_type) ? "    " : "";
          code += indent + "    builder.Prepend" + GenMethod(field) + "(";
          code += nameprefix + namer_.Variable(field);
          size_t array_cnt = index + (IsArray(field_type) ? 1 : 0);
          for (size_t i = 0; in_array && i < array_cnt; i++) {
            code += "[_idx" + NumToString(i) + "-1]";
          }
          code += ")\n";
        }
      }
    }
  }